

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O0

pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> * __thiscall
OpenMD::Sphere::getBoundingBox(Sphere *this)

{
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *in_RSI;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *in_RDI;
  Vector3d r;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *boundary;
  double in_stack_ffffffffffffff88;
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_> *this_00;
  
  this_00 = in_RDI;
  std::pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>_>::
  pair<OpenMD::Vector3<double>,_OpenMD::Vector3<double>,_true>(in_RSI);
  Vector3<double>::Vector3(&this_00->first,(double)in_RDI,(double)in_RSI,in_stack_ffffffffffffff88);
  OpenMD::operator-((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_RSI);
  Vector3<double>::operator=(&in_RDI->first,(Vector<double,_3U> *)in_RSI);
  OpenMD::operator+((Vector<double,_3U> *)in_RDI,(Vector<double,_3U> *)in_RSI);
  Vector3<double>::operator=(&in_RDI->first,(Vector<double,_3U> *)in_RSI);
  return this_00;
}

Assistant:

std::pair<Vector3d, Vector3d> Sphere::getBoundingBox() {
    std::pair<Vector3d, Vector3d> boundary;
    Vector3d r(radius_, radius_, radius_);
    boundary.first  = origin_ - r;
    boundary.second = origin_ + r;
    return boundary;
  }